

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

iterator __thiscall cmLinkedTree<cmDefinitions>::Pop(cmLinkedTree<cmDefinitions> *this,iterator it)

{
  pointer *ppuVar1;
  pointer pcVar2;
  pointer pcVar3;
  iterator iVar4;
  PositionType PVar5;
  PositionType PVar6;
  iterator it_local;
  
  PVar5 = it.Position;
  it_local.Tree = it.Tree;
  pcVar2 = (this->Data).super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->Data).super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
           super__Vector_impl_data._M_finish;
  it_local.Position = PVar5;
  if (pcVar2 == pcVar3) {
    __assert_fail("!this->Data.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                  ,0x90,"iterator cmLinkedTree<cmDefinitions>::Pop(iterator) [T = cmDefinitions]");
  }
  PVar6 = (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (PVar6 == ((long)pcVar3 - (long)pcVar2) / 0x38) {
    iterator::operator++(&it_local);
    if (PVar6 == PVar5) {
      std::vector<cmDefinitions,_std::allocator<cmDefinitions>_>::pop_back(&this->Data);
      ppuVar1 = &(this->UpPositions).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + -1;
    }
    iVar4.Position = it_local.Position;
    iVar4.Tree = it_local.Tree;
    return iVar4;
  }
  __assert_fail("this->UpPositions.size() == this->Data.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                ,0x91,"iterator cmLinkedTree<cmDefinitions>::Pop(iterator) [T = cmDefinitions]");
}

Assistant:

iterator Pop(iterator it)
  {
    assert(!this->Data.empty());
    assert(this->UpPositions.size() == this->Data.size());
    bool const isLast = this->IsLast(it);
    ++it;
    // If this is the last entry then no other entry can refer
    // to it so we can drop its storage.
    if (isLast) {
      this->Data.pop_back();
      this->UpPositions.pop_back();
    }
    return it;
  }